

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool duckdb_snappy::Uncompress(Source *compressed,Sink *uncompressed)

{
  pointer pDVar1;
  pointer pDVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar6;
  uint32_t uncompressed_len_00;
  undefined1 *puVar7;
  ulong uVar8;
  uint32_t uncompressed_len;
  char c;
  size_t allocated_size;
  SnappyDecompressor decompressor;
  SnappySinkAllocator allocator;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> writer;
  uint32_t local_f0;
  undefined1 local_e9;
  ulong local_e8;
  SnappyDecompressor local_e0;
  Sink *local_b0;
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  local_a8;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> local_90;
  pointer pDVar5;
  
  local_e0.peeked_ = 0;
  local_e0.eof_ = false;
  local_e0.ip_ = (char *)0x0;
  local_e0.ip_limit_ = (char *)0x0;
  local_f0 = 0;
  local_e0.reader_ = compressed;
  bVar3 = SnappyDecompressor::ReadUncompressedLength(&local_e0,&local_f0);
  if (bVar3) {
    puVar7 = &local_e9;
    iVar4 = (*uncompressed->_vptr_Sink[5])(uncompressed,1,(ulong)local_f0,puVar7,1,&local_e8);
    uncompressed_len_00 = (uint32_t)puVar7;
    pDVar5 = (pointer)CONCAT44(extraout_var,iVar4);
    (*compressed->_vptr_Source[2])(compressed);
    uVar6 = (ulong)local_f0;
    if (local_e8 < uVar6) {
      local_a8.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0 = uncompressed;
      local_90.allocator_.dest_ = uncompressed;
      std::
      vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ::vector(&local_90.allocator_.blocks_,&local_a8);
      local_90.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.full_size_ = 0;
      local_90.op_base_ = (char *)0x0;
      local_90.op_ptr_ = (char *)0x0;
      local_90.op_limit_ = (char *)0x0;
      local_90.op_limit_min_slop_ = (char *)0x0;
      bVar3 = InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
                        (&local_e0,&local_90,local_f0,uncompressed_len_00);
      if (local_90.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_90.allocator_.blocks_.
          super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.allocator_.blocks_.
                        super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.
          super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      local_90.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&pDVar5->data + uVar6);
      uVar8 = 0x3f;
      if (uVar6 < 0x3f) {
        uVar8 = uVar6;
      }
      local_90.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_90.allocator_.blocks_.
                           super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                           ._M_impl.super__Vector_impl_data._M_finish - uVar8);
      local_90.allocator_.dest_ = (Sink *)pDVar5;
      local_90.allocator_.blocks_.
      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_start = pDVar5;
      SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyArrayWriter>
                (&local_e0,(SnappyArrayWriter *)&local_90);
      pDVar2 = local_90.allocator_.blocks_.
               super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pDVar1 = local_90.allocator_.blocks_.
               super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = local_e0.eof_;
      (*uncompressed->_vptr_Sink[2])
                (uncompressed,pDVar5,
                 (long)local_90.allocator_.blocks_.
                       super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_90.allocator_.dest_);
      bVar3 = (bool)(bVar3 & pDVar1 == pDVar2);
    }
  }
  else {
    bVar3 = false;
  }
  (*(local_e0.reader_)->_vptr_Source[4])(local_e0.reader_,(ulong)local_e0.peeked_);
  return bVar3;
}

Assistant:

bool Uncompress(Source* compressed, Sink* uncompressed) {
  // Read the uncompressed length from the front of the compressed input
  SnappyDecompressor decompressor(compressed);
  uint32_t uncompressed_len = 0;
  if (!decompressor.ReadUncompressedLength(&uncompressed_len)) {
    return false;
  }

  char c;
  size_t allocated_size;
  char* buf = uncompressed->GetAppendBufferVariable(1, uncompressed_len, &c, 1,
                                                    &allocated_size);

  const size_t compressed_len = compressed->Available();
  // If we can get a flat buffer, then use it, otherwise do block by block
  // uncompression
  if (allocated_size >= uncompressed_len) {
    SnappyArrayWriter writer(buf);
    bool result = InternalUncompressAllTags(&decompressor, &writer,
                                            compressed_len, uncompressed_len);
    uncompressed->Append(buf, writer.Produced());
    return result;
  } else {
    SnappySinkAllocator allocator(uncompressed);
    SnappyScatteredWriter<SnappySinkAllocator> writer(allocator);
    return InternalUncompressAllTags(&decompressor, &writer, compressed_len,
                                     uncompressed_len);
  }
}